

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::apply_undo(CVmObjLookupTable *this,CVmUndoRecord *undo_rec)

{
  vm_lookup_ext *pvVar1;
  CVmObjLookupTable *in_RSI;
  vm_val_t *in_RDI;
  lookuptab_undo_rec *rec;
  vm_val_t *in_stack_ffffffffffffffd0;
  vm_val_t *key;
  CVmObjLookupTable *pCVar2;
  
  if ((in_RSI->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    key = (vm_val_t *)(in_RSI->super_CVmObjCollection).super_CVmObject.ext_;
    switch((vm_val_t *)(ulong)key->typ) {
    case (vm_val_t *)0x0:
      break;
    case (vm_val_t *)0x1:
      del_entry(in_RSI,key);
      break;
    case (vm_val_t *)0x2:
      add_entry(in_RSI,key,in_RDI);
      break;
    case (vm_val_t *)0x3:
      mod_entry((CVmObjLookupTable *)in_RDI,(vm_val_t *)(ulong)key->typ,in_stack_ffffffffffffffd0);
      break;
    case (vm_val_t *)0x4:
      pCVar2 = in_RSI;
      pvVar1 = get_ext((CVmObjLookupTable *)in_RDI);
      *(_func_int ***)&pvVar1->default_value =
           in_RSI[1].super_CVmObjCollection.super_CVmObject._vptr_CVmObject;
      (pvVar1->default_value).val =
           (anon_union_8_8_cb74652f_for_val)in_RSI[1].super_CVmObjCollection.super_CVmObject.ext_;
      in_RSI = pCVar2;
    }
    free(key);
    (in_RSI->super_CVmObjCollection).super_CVmObject.ext_ = (char *)0x0;
  }
  return;
}

Assistant:

void CVmObjLookupTable::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        lookuptab_undo_rec *rec;

        /* get our private record from the standard undo record */
        rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;
    
        /* check the action in the record */
        switch(rec->action)
        {
        case LOOKUPTAB_UNDO_NULL:
            /* 
             *   null record, which means that it had a weak reference to an
             *   object that has been deleted - there's no way to reinstate
             *   such records, so ignore it 
             */
            break;
            
        case LOOKUPTAB_UNDO_ADD:
            /* we added the entry, so we must now delete it */
            del_entry(vmg_ &rec->key);
            break;

        case LOOKUPTAB_UNDO_DEL:
            /* we deleted the entry, so we must now add it */
            add_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_MOD:
            /* we modified the entry, so we must change it back */
            mod_entry(vmg_ &rec->key, &undo_rec->oldval);
            break;

        case LOOKUPTAB_UNDO_DEFVAL:
            /* we modified the default value; change it back */
            get_ext()->default_value = undo_rec->oldval;
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}